

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

void add_trailing_sep(DString *path)

{
  _Bool _Var1;
  char sep;
  DString *path_local;
  
  if ((path->currentStringLength != 0) &&
     (_Var1 = is_separator(path->str[path->currentStringLength - 1]), _Var1)) {
    return;
  }
  d_string_append_c(path,'/');
  return;
}

Assistant:

void add_trailing_sep(DString * path) {
#if defined(__WIN32)
	char sep = '\\';
#else
	char sep = '/';
#endif

	// Ensure that folder ends in separator
	if ((path->currentStringLength == 0) || (!is_separator(path->str[path->currentStringLength - 1]))) {
		d_string_append_c(path, sep);
	}
}